

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O2

void __thiscall
slang::ast::CallExpression::visitExprs<LookupIdentifier&>
          (CallExpression *this,LookupIdentifier *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  visitExprsNoArgs<LookupIdentifier&>(this,visitor);
  ppEVar1 = (this->arguments_)._M_ptr;
  sVar2 = (this->arguments_)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<LookupIdentifier&>(*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        visitExprsNoArgs(visitor);
        for (auto arg : arguments())
            arg->visit(visitor);
    }